

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O1

bool RunTests(void)

{
  code *pcVar1;
  bool bVar2;
  char cVar3;
  size_t sVar4;
  ulong uVar5;
  code **ppcVar6;
  bool bVar7;
  code *local_b8;
  char *local_b0;
  code *local_a8;
  char *local_a0;
  code *local_98;
  char *local_90;
  code *local_88;
  char *local_80;
  code *local_78;
  char *local_70;
  code *local_68;
  char *local_60;
  code *local_58;
  char *local_50;
  code *local_48;
  char *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  ppcVar6 = &local_b8;
  local_b8 = TestAssignment;
  local_b0 = "TestAssignment";
  local_a8 = TestConstants;
  local_a0 = "TestConstants";
  local_98 = TestIncrement;
  local_90 = "TestIncrement";
  local_88 = TestComparisons;
  local_80 = "TestComparisons";
  local_78 = TestGetTickCount;
  local_70 = "TestGetTickCount";
  local_68 = TestCompression;
  local_60 = "TestCompression";
  local_58 = TestCompressionNoBias8;
  local_50 = "TestCompressionNoBias8";
  local_48 = TestCompressionNoBias16;
  local_40 = "TestCompressionNoBias16";
  local_38 = 0;
  uStack_30 = 0;
  bVar7 = false;
  bVar2 = TestAssignment();
  if (bVar2) {
    uVar5 = 1;
    ppcVar6 = &local_b8;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Test passed: ",0xd);
      pcVar1 = ppcVar6[1];
      if (pcVar1 == (code *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x106040);
      }
      else {
        sVar4 = strlen((char *)pcVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)pcVar1,sVar4);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
      std::ostream::put('@');
      std::ostream::flush();
      bVar7 = (&local_b8)[uVar5 * 2] == (code *)0x0;
      if (bVar7) {
        return bVar7;
      }
      ppcVar6 = &local_b8 + uVar5 * 2;
      cVar3 = (*(&local_b8)[uVar5 * 2])();
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (cVar3 != '\0');
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Test failed: ",0xd);
  pcVar1 = ppcVar6[1];
  if (pcVar1 == (code *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x106040);
  }
  else {
    sVar4 = strlen((char *)pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)pcVar1,sVar4);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  return bVar7;
}

Assistant:

TestDescriptor(TestF fn = nullptr, const char* name = nullptr)
        : Function(fn)
        , Name(name)
    {
    }